

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_LoadThings(MapData *map)

{
  byte *pbVar1;
  FMapThing *mt;
  short sVar2;
  FileReader *pFVar3;
  long lVar4;
  FMapThing *pFVar5;
  Node *pNVar6;
  ushort uVar7;
  WORD WVar8;
  short *psVar9;
  FDoomEdEntry *pFVar10;
  Node *pNVar11;
  uint amount;
  ushort uVar12;
  ulong uVar13;
  uint recordnum;
  short *psVar14;
  uint uVar15;
  
  pFVar3 = map->MapLumps[1].Reader;
  if (pFVar3 == (FileReader *)0x0) {
    uVar13 = 0;
  }
  else {
    uVar13 = (ulong)(int)pFVar3->Length;
  }
  psVar9 = (short *)operator_new__(uVar13);
  lVar4 = pFVar3->Length;
  map->file = pFVar3;
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,psVar9,(long)(int)lVar4);
  amount = (uint)(uVar13 / 10);
  TArray<FMapThing,_FMapThing>::Resize(&MapThingsConverted,amount);
  pFVar5 = MapThingsConverted.Array;
  if (0 < (int)amount) {
    uVar13 = 0;
    psVar14 = psVar9;
    do {
      uVar12 = psVar14[4];
      recordnum = (uint)(short)uVar12;
      mt = pFVar5 + uVar13;
      memset(mt,0,0x90);
      pFVar5[uVar13].Gravity = 1.0;
      pFVar5[uVar13].Conversation = 0;
      sVar2 = (ushort)((recordnum & 1) != 0) * 3;
      WVar8 = sVar2 + 0x18 + (uVar12 & 2) * 2;
      if ((uVar12 & 4) == 0) {
        WVar8 = sVar2 + (uVar12 & 2) * 2;
      }
      pFVar5[uVar13].SkillFilter = WVar8;
      pFVar5[uVar13].ClassFilter = 0xffff;
      pFVar5[uVar13].RenderStyle = 0xe;
      pFVar5[uVar13].FloatbobPhase = -1;
      pFVar5[uVar13].Alpha = -1.0;
      pFVar5[uVar13].health = 1;
      pFVar5[uVar13].pos.X = (double)(int)*psVar14;
      pFVar5[uVar13].pos.Y = (double)(int)psVar14[1];
      pFVar5[uVar13].angle = psVar14[2];
      sVar2 = psVar14[3];
      pFVar5[uVar13].EdNum = sVar2;
      pNVar6 = DoomEdMap.Nodes + (DoomEdMap.Size - 1 & (int)sVar2);
      do {
        pNVar11 = pNVar6;
        if ((pNVar11 == (Node *)0x0) || (pNVar11->Next == (Node *)0x1)) {
          pNVar11 = (Node *)0x0;
          break;
        }
        pNVar6 = pNVar11->Next;
      } while ((pNVar11->Pair).Key != (int)sVar2);
      pFVar10 = &(pNVar11->Pair).Value;
      if (pNVar11 == (Node *)0x0) {
        pFVar10 = (FDoomEdEntry *)0x0;
      }
      mt->info = pFVar10;
      if ((pNVar11 == (Node *)0x0) || (pFVar10->Special != 0x19)) {
        uVar15 = (uint)uVar12;
        mt->flags = uVar15 & 8 | 0x7e0;
        if (gameinfo.gametype == GAME_Strife) {
          mt->flags = (recordnum & 0x200) * 8 + (recordnum & 0x100) * 8 + 0x7e0;
          if ((recordnum & 8) != 0) {
            pbVar1 = (byte *)((long)&mt->flags + 1);
            *pbVar1 = *pbVar1 | 0x40;
          }
          if ((uVar12 & 0x20) != 0) {
            *(byte *)&mt->flags = (byte)mt->flags | 8;
          }
          if ((uVar12 & 0x40) != 0) {
LAB_00447db5:
            pbVar1 = (byte *)((long)&mt->flags + 1);
            *pbVar1 = *pbVar1 | 0x20;
          }
        }
        else {
          uVar7 = uVar12 & 0x18;
          if ((recordnum >> 8 & 1) == 0) {
            uVar7 = uVar12;
          }
          uVar12 = uVar7;
          if ((uVar12 & 0x20) != 0) {
            mt->flags = uVar15 & 8 | 0x3e0;
          }
          if ((uVar12 & 0x40) != 0) {
            pbVar1 = (byte *)((long)&mt->flags + 1);
            *pbVar1 = *pbVar1 & 0xfd;
          }
          if ((char)uVar12 < '\0') goto LAB_00447db5;
        }
        if ((uVar12 & 0x10) != 0) {
          pbVar1 = (byte *)((long)&mt->flags + 1);
          *pbVar1 = *pbVar1 & 0xfe;
        }
      }
      else {
        ProcessEDMapthing(mt,recordnum);
      }
      uVar13 = uVar13 + 1;
      psVar14 = psVar14 + 5;
    } while (uVar13 != (amount & 0x7fffffff));
  }
  operator_delete__(psVar9);
  return;
}

Assistant:

void P_LoadThings (MapData * map)
{
	int	lumplen = map->Size(ML_THINGS);
	int numthings = lumplen / sizeof(mapthing_t);

	char *mtp;
	mapthing_t *mt;

	mtp = new char[lumplen];
	map->Read(ML_THINGS, mtp);
	mt = (mapthing_t*)mtp;

	MapThingsConverted.Resize(numthings);
	FMapThing *mti = &MapThingsConverted[0];

	// [RH] ZDoom now uses Hexen-style maps as its native format.
	//		Since this is the only place where Doom-style Things are ever
	//		referenced, we translate them into a Hexen-style thing.
	for (int i=0 ; i < numthings; i++, mt++)
	{
		// [RH] At this point, monsters unique to Doom II were weeded out
		//		if the IWAD wasn't for Doom II. P_SpawnMapThing() can now
		//		handle these and more cases better, so we just pass it
		//		everything and let it decide what to do with them.

		// [RH] Need to translate the spawn flags to Hexen format.
		short flags = LittleShort(mt->options);

		memset (&mti[i], 0, sizeof(mti[i]));

		mti[i].Gravity = 1;
		mti[i].Conversation = 0;
		mti[i].SkillFilter = MakeSkill(flags);
		mti[i].ClassFilter = 0xffff;	// Doom map format doesn't have class flags so spawn for all player classes
		mti[i].RenderStyle = STYLE_Count;
		mti[i].Alpha = -1;
		mti[i].health = 1;
		mti[i].FloatbobPhase = -1;

		mti[i].pos.X = LittleShort(mt->x);
		mti[i].pos.Y = LittleShort(mt->y);
		mti[i].angle = LittleShort(mt->angle);
		mti[i].EdNum = LittleShort(mt->type);
		mti[i].info = DoomEdMap.CheckKey(mti[i].EdNum);


#ifndef NO_EDATA
		if (mti[i].info != NULL && mti[i].info->Special == SMT_EDThing)
		{
			ProcessEDMapthing(&mti[i], flags);
		}
		else
#endif
		{
			flags &= ~MTF_SKILLMASK;
			mti[i].flags = (short)((flags & 0xf) | 0x7e0);
			if (gameinfo.gametype == GAME_Strife)
			{
				mti[i].flags &= ~MTF_AMBUSH;
				if (flags & STF_SHADOW)			mti[i].flags |= MTF_SHADOW;
				if (flags & STF_ALTSHADOW)		mti[i].flags |= MTF_ALTSHADOW;
				if (flags & STF_STANDSTILL)		mti[i].flags |= MTF_STANDSTILL;
				if (flags & STF_AMBUSH)			mti[i].flags |= MTF_AMBUSH;
				if (flags & STF_FRIENDLY)		mti[i].flags |= MTF_FRIENDLY;
			}
			else
			{
				if (flags & BTF_BADEDITORCHECK)
				{
					flags &= 0x1F;
				}
				if (flags & BTF_NOTDEATHMATCH)	mti[i].flags &= ~MTF_DEATHMATCH;
				if (flags & BTF_NOTCOOPERATIVE)	mti[i].flags &= ~MTF_COOPERATIVE;
				if (flags & BTF_FRIENDLY)		mti[i].flags |= MTF_FRIENDLY;
			}
			if (flags & BTF_NOTSINGLE)			mti[i].flags &= ~MTF_SINGLE;
		}
	}
	delete [] mtp;
}